

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::Options::add_to_option(Options *this,string *option,string *arg)

{
  int *piVar1;
  long lVar2;
  _Base_ptr this_00;
  undefined8 *puVar3;
  iterator iVar4;
  option_not_exists_exception *this_01;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
          ::find(&(this->m_options)._M_t,option);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->m_options)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (option_not_exists_exception *)__cxa_allocate_exception(0x28);
    option_not_exists_exception::option_not_exists_exception(this_01,option);
    __cxa_throw(this_01,&option_not_exists_exception::typeinfo,OptionException::~OptionException);
  }
  lVar2 = *(long *)(iVar4._M_node + 2);
  this_00 = iVar4._M_node[2]._M_parent;
  if (this_00 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
    }
  }
  puVar3 = *(undefined8 **)(lVar2 + 0x20);
  (**(code **)*puVar3)(puVar3,arg);
  piVar1 = (int *)(lVar2 + 0x30);
  *piVar1 = *piVar1 + 1;
  if (this_00 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    return;
  }
  return;
}

Assistant:

void
Options::add_to_option(const std::string& option, const std::string& arg)
{
  auto iter = m_options.find(option);

  if (iter == m_options.end())
  {
    throw option_not_exists_exception(option);
  }

  parse_option(iter->second, option, arg);
}